

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::predict<true,false>(gd *g,base_learner *param_2,example *ec)

{
  example *in_RDX;
  vw *in_RSI;
  long in_RDI;
  float fVar1;
  vw *all;
  shared_data *in_stack_ffffffffffffffd8;
  long *gravity;
  
  gravity = *(long **)(in_RDI + 0x60);
  fVar1 = trunc_predict(in_RSI,in_RDX,(double)gravity);
  in_RDX->partial_prediction = fVar1;
  in_RDX->partial_prediction = (float)*(double *)(*gravity + 0x60) * in_RDX->partial_prediction;
  fVar1 = finalize_prediction(in_stack_ffffffffffffffd8,0.0);
  (in_RDX->pred).scalar = fVar1;
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}